

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void auxsetstr(lua_State *L,TValue *t,char *k)

{
  StkId pTVar1;
  bool bVar2;
  TString *key;
  TString *x_;
  TValue *io;
  TString *str;
  TValue *slot;
  char *k_local;
  TValue *t_local;
  lua_State *L_local;
  
  key = luaS_new(L,k);
  if (t->tt_ == 0x45) {
    str = (TString *)luaH_getstr((Table *)(t->value_).gc,key);
    if (*(int *)&str->tt == 0) {
      bVar2 = false;
    }
    else {
      if ((((L->top[-1].tt_ & 0x40U) != 0) && ((((t->value_).gc)->marked & 4) != 0)) &&
         (((L->top[-1].value_.gc)->marked & 3) != 0)) {
        luaC_barrierback_(L,(Table *)(t->value_).gc);
      }
      pTVar1 = L->top;
      *(Value *)&str->next = pTVar1[-1].value_;
      *(undefined8 *)&str->tt = *(undefined8 *)&pTVar1[-1].tt_;
      bVar2 = true;
    }
    if (bVar2) {
      L->top = L->top + -1;
      return;
    }
  }
  else {
    str = (TString *)0x0;
  }
  pTVar1 = L->top;
  (pTVar1->value_).gc = (GCObject *)key;
  pTVar1->tt_ = key->tt | 0x40;
  L->top = L->top + 1;
  luaV_finishset(L,t,L->top + -1,L->top + -2,(TValue *)str);
  L->top = L->top + -2;
  return;
}

Assistant:

static void auxsetstr (lua_State *L, const TValue *t, const char *k) {
  const TValue *slot;
  TString *str = luaS_new(L, k);
  api_checknelems(L, 1);
  if (luaV_fastset(L, t, str, slot, luaH_getstr, L->top - 1))
    L->top--;  /* pop value */
  else {
    setsvalue2s(L, L->top, str);  /* push 'str' (to make it a TValue) */
    api_incr_top(L);
    luaV_finishset(L, t, L->top - 1, L->top - 2, slot);
    L->top -= 2;  /* pop value and key */
  }
  lua_unlock(L);  /* lock done by caller */
}